

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

bool __thiscall cmDependsFortran::FindModule(cmDependsFortran *this,string *name,string *module)

{
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string mod_lower;
  string mod_upper;
  string fullName;
  string local_118;
  string local_f8;
  string local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  undefined8 local_a8;
  undefined1 *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  string *local_88;
  string local_80;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_88 = module;
  cmFortranModuleAppendUpperLower(name,&local_f8,&local_118);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  pbVar3 = (this->super_cmDepends).IncludePath.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmDepends).IncludePath.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 == pbVar1) {
    bVar2 = false;
  }
  else {
    do {
      local_b8._M_str = (pbVar3->_M_dataplus)._M_p;
      local_b8._M_len = pbVar3->_M_string_length;
      local_60 = 1;
      local_50[0] = 0x2f;
      local_a8 = 1;
      local_98 = local_118._M_string_length;
      local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_118._M_dataplus._M_p;
      views._M_len = 3;
      views._M_array = &local_b8;
      local_a0 = local_50;
      local_58 = local_50;
      cmCatViews_abi_cxx11_(&local_80,views);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      bVar2 = cmsys::SystemTools::FileExists(&local_d8,true);
      if (bVar2) {
LAB_0016bcad:
        bVar2 = true;
        std::__cxx11::string::_M_assign((string *)local_88);
        goto LAB_0016bcd5;
      }
      local_b8._M_str = (pbVar3->_M_dataplus)._M_p;
      local_b8._M_len = pbVar3->_M_string_length;
      local_60 = 1;
      local_50[0] = 0x2f;
      local_a8 = 1;
      local_98 = local_f8._M_string_length;
      local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_f8._M_dataplus._M_p;
      views_00._M_len = 3;
      views_00._M_array = &local_b8;
      local_a0 = local_50;
      local_58 = local_50;
      cmCatViews_abi_cxx11_(&local_80,views_00);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      bVar2 = cmsys::SystemTools::FileExists(&local_d8,true);
      if (bVar2) goto LAB_0016bcad;
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
    bVar2 = false;
  }
LAB_0016bcd5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool cmDependsFortran::FindModule(std::string const& name, std::string& module)
{
  // Construct possible names for the module file.
  std::string mod_upper;
  std::string mod_lower;
  cmFortranModuleAppendUpperLower(name, mod_upper, mod_lower);

  // Search the include path for the module.
  std::string fullName;
  for (std::string const& ip : this->IncludePath) {
    // Try the lower-case name.
    fullName = cmStrCat(ip, '/', mod_lower);
    if (cmSystemTools::FileExists(fullName, true)) {
      module = fullName;
      return true;
    }

    // Try the upper-case name.
    fullName = cmStrCat(ip, '/', mod_upper);
    if (cmSystemTools::FileExists(fullName, true)) {
      module = fullName;
      return true;
    }
  }
  return false;
}